

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

void kwsysProcessSetExitException(cmsysProcess *cp,int sig)

{
  char *__s;
  undefined8 uVar1;
  
  __s = cp->ExitExceptionString;
  switch(sig) {
  case 1:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGHUP",7);
    return;
  case 2:
    cp->ExitException = 3;
    builtin_strncpy(cp->ExitExceptionString + 7,"terrupt",8);
    uVar1 = 0x746e692072657355;
    goto LAB_0014232f;
  case 3:
    cp->ExitException = 5;
    uVar1 = 0x54495551474953;
    break;
  case 4:
    cp->ExitException = 2;
    builtin_strncpy(__s,"Illegal instruction",0x14);
    return;
  case 5:
    cp->ExitException = 5;
    uVar1 = 0x50415254474953;
    break;
  case 6:
    cp->ExitException = 5;
    builtin_strncpy(cp->ExitExceptionString + 6,"aborted",8);
    uVar1 = 0x626120646c696843;
    goto LAB_0014232f;
  case 7:
    cp->ExitException = 1;
    builtin_strncpy(__s,"Bus error",10);
    return;
  case 8:
    cp->ExitException = 4;
    builtin_strncpy(__s,"Floating-point exception",0x19);
    return;
  case 9:
    cp->ExitException = 5;
    builtin_strncpy(cp->ExitExceptionString + 5," killed",8);
    uVar1 = 0x696b20646c696843;
LAB_0014232f:
    *(undefined8 *)__s = uVar1;
    return;
  case 10:
    cp->ExitException = 5;
    uVar1 = 0x31525355474953;
    break;
  case 0xb:
    cp->ExitException = 1;
    builtin_strncpy(__s,"Segmentation fault",0x13);
    return;
  case 0xc:
    cp->ExitException = 5;
    uVar1 = 0x32525355474953;
    break;
  case 0xd:
    cp->ExitException = 5;
    uVar1 = 0x45504950474953;
    break;
  case 0xe:
    cp->ExitException = 5;
    uVar1 = 0x4d524c41474953;
    break;
  case 0xf:
    cp->ExitException = 5;
    builtin_strncpy(__s,"Child terminated",0x11);
    return;
  case 0x10:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGSTKFLT",10);
    return;
  case 0x11:
    cp->ExitException = 5;
    uVar1 = 0x444c4843474953;
    break;
  case 0x12:
    cp->ExitException = 5;
    uVar1 = 0x544e4f43474953;
    break;
  case 0x13:
    cp->ExitException = 5;
    uVar1 = 0x504f5453474953;
    break;
  case 0x14:
    cp->ExitException = 5;
    uVar1 = 0x50545354474953;
    break;
  case 0x15:
    cp->ExitException = 5;
    uVar1 = 0x4e495454474953;
    break;
  case 0x16:
    cp->ExitException = 5;
    uVar1 = 0x554f5454474953;
    break;
  case 0x17:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGURG",7);
    return;
  case 0x18:
    cp->ExitException = 5;
    uVar1 = 0x55504358474953;
    break;
  case 0x19:
    cp->ExitException = 5;
    uVar1 = 0x5a534658474953;
    break;
  case 0x1a:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGVTALRM",10);
    return;
  case 0x1b:
    cp->ExitException = 5;
    uVar1 = 0x464f5250474953;
    break;
  case 0x1c:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGWINCH",9);
    return;
  case 0x1d:
    cp->ExitException = 5;
    uVar1 = 0x4c4c4f50474953;
    break;
  case 0x1e:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGPWR",7);
    return;
  case 0x1f:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGSYS",7);
    return;
  default:
    cp->ExitException = 5;
    sprintf(__s,"Signal %d");
    return;
  }
  *(undefined8 *)cp->ExitExceptionString = uVar1;
  return;
}

Assistant:

static void kwsysProcessSetExitException(kwsysProcess* cp, int sig)
{
  switch (sig)
    {
#ifdef SIGSEGV
    case SIGSEGV: KWSYSPE_CASE(Fault, "Segmentation fault"); break;
#endif
#ifdef SIGBUS
# if !defined(SIGSEGV) || SIGBUS != SIGSEGV
    case SIGBUS: KWSYSPE_CASE(Fault, "Bus error"); break;
# endif
#endif
#ifdef SIGFPE
    case SIGFPE: KWSYSPE_CASE(Numerical, "Floating-point exception"); break;
#endif
#ifdef SIGILL
    case SIGILL: KWSYSPE_CASE(Illegal, "Illegal instruction"); break;
#endif
#ifdef SIGINT
    case SIGINT: KWSYSPE_CASE(Interrupt, "User interrupt"); break;
#endif
#ifdef SIGABRT
    case SIGABRT: KWSYSPE_CASE(Other, "Child aborted"); break;
#endif
#ifdef SIGKILL
    case SIGKILL: KWSYSPE_CASE(Other, "Child killed"); break;
#endif
#ifdef SIGTERM
    case SIGTERM: KWSYSPE_CASE(Other, "Child terminated"); break;
#endif
#ifdef SIGHUP
    case SIGHUP: KWSYSPE_CASE(Other, "SIGHUP"); break;
#endif
#ifdef SIGQUIT
    case SIGQUIT: KWSYSPE_CASE(Other, "SIGQUIT"); break;
#endif
#ifdef SIGTRAP
    case SIGTRAP: KWSYSPE_CASE(Other, "SIGTRAP"); break;
#endif
#ifdef SIGIOT
# if !defined(SIGABRT) || SIGIOT != SIGABRT
    case SIGIOT: KWSYSPE_CASE(Other, "SIGIOT"); break;
# endif
#endif
#ifdef SIGUSR1
    case SIGUSR1: KWSYSPE_CASE(Other, "SIGUSR1"); break;
#endif
#ifdef SIGUSR2
    case SIGUSR2: KWSYSPE_CASE(Other, "SIGUSR2"); break;
#endif
#ifdef SIGPIPE
    case SIGPIPE: KWSYSPE_CASE(Other, "SIGPIPE"); break;
#endif
#ifdef SIGALRM
    case SIGALRM: KWSYSPE_CASE(Other, "SIGALRM"); break;
#endif
#ifdef SIGSTKFLT
    case SIGSTKFLT: KWSYSPE_CASE(Other, "SIGSTKFLT"); break;
#endif
#ifdef SIGCHLD
    case SIGCHLD: KWSYSPE_CASE(Other, "SIGCHLD"); break;
#elif defined(SIGCLD)
    case SIGCLD: KWSYSPE_CASE(Other, "SIGCLD"); break;
#endif
#ifdef SIGCONT
    case SIGCONT: KWSYSPE_CASE(Other, "SIGCONT"); break;
#endif
#ifdef SIGSTOP
    case SIGSTOP: KWSYSPE_CASE(Other, "SIGSTOP"); break;
#endif
#ifdef SIGTSTP
    case SIGTSTP: KWSYSPE_CASE(Other, "SIGTSTP"); break;
#endif
#ifdef SIGTTIN
    case SIGTTIN: KWSYSPE_CASE(Other, "SIGTTIN"); break;
#endif
#ifdef SIGTTOU
    case SIGTTOU: KWSYSPE_CASE(Other, "SIGTTOU"); break;
#endif
#ifdef SIGURG
    case SIGURG: KWSYSPE_CASE(Other, "SIGURG"); break;
#endif
#ifdef SIGXCPU
    case SIGXCPU: KWSYSPE_CASE(Other, "SIGXCPU"); break;
#endif
#ifdef SIGXFSZ
    case SIGXFSZ: KWSYSPE_CASE(Other, "SIGXFSZ"); break;
#endif
#ifdef SIGVTALRM
    case SIGVTALRM: KWSYSPE_CASE(Other, "SIGVTALRM"); break;
#endif
#ifdef SIGPROF
    case SIGPROF: KWSYSPE_CASE(Other, "SIGPROF"); break;
#endif
#ifdef SIGWINCH
    case SIGWINCH: KWSYSPE_CASE(Other, "SIGWINCH"); break;
#endif
#ifdef SIGPOLL
    case SIGPOLL: KWSYSPE_CASE(Other, "SIGPOLL"); break;
#endif
#ifdef SIGIO
# if !defined(SIGPOLL) || SIGIO != SIGPOLL
    case SIGIO: KWSYSPE_CASE(Other, "SIGIO"); break;
# endif
#endif
#ifdef SIGPWR
    case SIGPWR: KWSYSPE_CASE(Other, "SIGPWR"); break;
#endif
#ifdef SIGSYS
    case SIGSYS: KWSYSPE_CASE(Other, "SIGSYS"); break;
#endif
#ifdef SIGUNUSED
# if !defined(SIGSYS) || SIGUNUSED != SIGSYS
    case SIGUNUSED: KWSYSPE_CASE(Other, "SIGUNUSED"); break;
# endif
#endif
    default:
      cp->ExitException = kwsysProcess_Exception_Other;
      sprintf(cp->ExitExceptionString, "Signal %d", sig);
      break;
    }
}